

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void deqp::gls::ShaderExecUtil::checkLimit(RenderContext *renderCtx,deUint32 pname,int required)

{
  int iVar1;
  undefined4 extraout_var;
  TestError *this;
  NotSupportedError *this_00;
  Enum<int,_2UL> EVar2;
  string local_240;
  string local_220;
  GetNameFunc local_200;
  int local_1f8;
  GetNameFunc local_1f0;
  int local_1e8;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  undefined1 local_119;
  GetNameFunc local_118;
  int local_110;
  GetNameFunc local_108;
  int local_100;
  string local_f8;
  GetNameFunc local_d8;
  int local_d0;
  GetNameFunc local_b8;
  int local_b0;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_28;
  int local_24;
  deUint32 error;
  int implementationLimit;
  Functions *gl;
  int required_local;
  deUint32 pname_local;
  RenderContext *renderCtx_local;
  
  gl._0_4_ = required;
  gl._4_4_ = pname;
  _required_local = renderCtx;
  iVar1 = (*renderCtx->_vptr_RenderContext[3])();
  _error = CONCAT44(extraout_var,iVar1);
  local_24 = -1;
  (**(code **)(_error + 0x868))(gl._4_4_,&local_24);
  local_28 = (**(code **)(_error + 0x800))();
  if (local_28 != 0) {
    local_119 = 1;
    this = (TestError *)__cxa_allocate_exception(0x38);
    EVar2 = glu::getGettableStateStr(gl._4_4_);
    local_d8 = EVar2.m_getName;
    local_d0 = EVar2.m_value;
    local_b8 = local_d8;
    local_b0 = local_d0;
    de::toString<tcu::Format::Enum<int,2ul>>(&local_a8,(de *)&local_b8,EVar2._8_8_);
    std::operator+(&local_88,"Failed to query ",&local_a8);
    std::operator+(&local_68,&local_88," - got ");
    EVar2 = glu::getErrorStr(local_28);
    local_118 = EVar2.m_getName;
    local_110 = EVar2.m_value;
    local_108 = local_118;
    local_100 = local_110;
    de::toString<tcu::Format::Enum<int,2ul>>(&local_f8,(de *)&local_108,EVar2._8_8_);
    std::operator+(&local_48,&local_68,&local_f8);
    tcu::TestError::TestError(this,&local_48);
    local_119 = 0;
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (local_24 < (int)gl) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    EVar2 = glu::getGettableStateStr(gl._4_4_);
    local_200 = EVar2.m_getName;
    local_1f8 = EVar2.m_value;
    local_1f0 = local_200;
    local_1e8 = local_1f8;
    de::toString<tcu::Format::Enum<int,2ul>>(&local_1e0,(de *)&local_1f0,EVar2._8_8_);
    std::operator+(&local_1c0,"Test requires ",&local_1e0);
    std::operator+(&local_1a0,&local_1c0," >= ");
    de::toString<int>(&local_220,(int *)&gl);
    std::operator+(&local_180,&local_1a0,&local_220);
    std::operator+(&local_160,&local_180,", got ");
    de::toString<int>(&local_240,&local_24);
    std::operator+(&local_140,&local_160,&local_240);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_140);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  return;
}

Assistant:

static void checkLimit (const glu::RenderContext& renderCtx, deUint32 pname, int required)
{
	const glw::Functions&	gl					= renderCtx.getFunctions();
	int						implementationLimit	= -1;
	deUint32				error;

	gl.getIntegerv(pname, &implementationLimit);
	error = gl.getError();

	if (error != GL_NO_ERROR)
		throw tcu::TestError("Failed to query " + de::toString(glu::getGettableStateStr(pname)) + " - got " + de::toString(glu::getErrorStr(error)));
	if (implementationLimit < required)
		throw tcu::NotSupportedError("Test requires " + de::toString(glu::getGettableStateStr(pname)) + " >= " + de::toString(required) + ", got " + de::toString(implementationLimit));
}